

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>,_2048UL,_2048UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  ulong uVar5;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar5 = (ulong)&stack0xffffffffffffffe0 & 0xfffffffffffff800;
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1fa47;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1fa5a;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  start_reentrant_emplace<density_tests::TestObject<2048ul,2048ul>,density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1040),
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)i_queue,(TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  uVar1 = *(undefined8 *)(uVar5 - 0x1038);
  uVar2 = *(undefined8 *)(uVar5 - 0x1030);
  uVar3 = *(undefined8 *)(uVar5 - 0x1028);
  this = (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar5 - 0x1020);
  (this->m_put).m_control_block =
       (((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar5 - 0x1040))
       ->m_put).m_control_block;
  *(undefined8 *)(uVar5 - 0x1018) = uVar1;
  *(undefined8 *)(uVar5 - 0x1010) = uVar2;
  *(undefined8 *)(uVar5 - 0x1008) = uVar3;
  *(undefined8 *)(uVar5 - 0x1030) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1fa86;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1040));
  uVar1 = *(undefined8 *)(uVar5 - 0x1018);
  uVar2 = *(undefined8 *)(uVar5 - 0x1010);
  uVar3 = *(undefined8 *)(uVar5 - 0x1008);
  *(LfQueueControl **)(uVar5 - 0x1060) = (this->m_put).m_control_block;
  *(undefined8 *)(uVar5 - 0x1058) = uVar1;
  *(undefined8 *)(uVar5 - 0x1050) = uVar2;
  *(undefined8 *)(uVar5 - 0x1048) = uVar3;
  *(undefined8 *)(uVar5 - 0x1010) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1faab;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this);
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1fab8;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1fabd;
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = *(void **)(uVar5 - 0x1050);
  uVar4 = *(uintptr_t *)(uVar5 - 0x1058);
  (__return_storage_ptr__->m_put).m_control_block =
       (((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar5 - 0x1060))
       ->m_put).m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = uVar4;
  __return_storage_ptr__->m_queue =
       *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         **)(uVar5 - 0x1048);
  *(undefined8 *)(uVar5 - 0x1050) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0xe1fae8;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1060));
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }